

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe32At1(uint8_t *buf)

{
  return (ulong)((uint)(*buf >> 1) |
                (uint)buf[1] << 7 | (uint)buf[2] << 0xf | (uint)*(ushort *)(buf + 3) << 0x17);
}

Assistant:

std::uint64_t readFlUIntLe32At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 7;
    res |= (buf[0] >> 1);
    res &= UINT64_C(0xffffffff);
    return res;
}